

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O3

HRESULT CreateLibraryByteCode(char *contentsRaw)

{
  JsErrorCode JVar1;
  ulong uVar2;
  JsValueRef local_48;
  JsValueRef bufferVal;
  BYTE *bcBuffer;
  uint bcBufferSize;
  
  bufferVal = (JsValueRef)0x0;
  bcBuffer._4_4_ = 0;
  GetSerializedBuffer(contentsRaw,WScriptJsrt::FinalizeFree,&local_48);
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetArrayBufferStorage)
                    (local_48,(BYTE **)&bufferVal,(uint *)((long)&bcBuffer + 4));
  if (-1 < (int)JVar1) {
    JVar1 = JsNoError;
    PAL_printf("[] = {\n/* 00000000 */");
    if (bcBuffer._4_4_ != 0) {
      uVar2 = 0;
      do {
        PAL_printf(" 0x%02X",(ulong)*(byte *)((long)bufferVal + uVar2));
        if (uVar2 < bcBuffer._4_4_ - 1) {
          PAL_printf(",");
        }
        if (((~(uint)uVar2 & 0xf) == 0) && (uVar2 < bcBuffer._4_4_ - 1)) {
          PAL_printf("\n/* %08X */",(ulong)((uint)uVar2 + 1));
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < bcBuffer._4_4_);
    }
    PAL_printf("};\n\n");
  }
  return JVar1;
}

Assistant:

HRESULT CreateLibraryByteCode(const char* contentsRaw)
{
    JsValueRef bufferVal;
    BYTE *bcBuffer = nullptr;
    unsigned int bcBufferSize = 0;
    HRESULT hr = E_FAIL;
    
    // Windows can't do the below with printf - so use windows API on windows but printf on posix
    #ifdef _WIN32
        HANDLE out = GetStdHandle(STD_OUTPUT_HANDLE);
        DWORD written = 0;
        #define print_format(format, element, size) \
        { \
            auto scratchLen = size; \
            char scratch[size]; \
            int len = _snprintf_s(scratch, scratchLen, _countof(scratch), format, element); \
            IfFalseGo(WriteFile(out, scratch, (DWORD)(len), &written, nullptr)); \
        }
        #define print(text) \
            WriteFile(out, text, (DWORD)strlen(text), &written, nullptr);
    #else
        #define print_format(format, element, size) printf(format, element)
        #define print printf
    #endif

    // Generate the bytecode, free the original buffer then retrieve the generated bytecode
    IfFailGo(GetSerializedBuffer(contentsRaw, WScriptJsrt::FinalizeFree, &bufferVal));
    IfFailGo(ChakraRTInterface::JsGetArrayBufferStorage(bufferVal, &bcBuffer, &bcBufferSize));

    // Write out the bytecode
    print("[] = {\n/* 00000000 */");

    for (unsigned int i = 0; i < bcBufferSize; i++)
    {
        print_format(" 0x%02X", bcBuffer[i], 6);
        // Add a comma if this is not the last item
        if (i < bcBufferSize - 1)
        {
            print(",");
        }

        // Add a line break every 16 scratches, primarily so the compiler doesn't complain about the string being too long.
        // Also, won't add for the last scratch
        if (i % 16 == 15 && i < bcBufferSize - 1)
        {
            print_format("\n/* %08X */", i + 1, 17);
        }
    }
    print("};\n\n");

    #undef print
    #undef print_format

    hr = S_OK;

Error:
    return hr;
}